

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

MasterLinkPtr __thiscall miniros::ServiceManager::getMasterLink(ServiceManager *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<miniros::MasterLink> *in_RSI;
  shared_ptr<miniros::MasterLink> *in_RDI;
  MasterLinkPtr MVar1;
  
  std::shared_ptr<miniros::MasterLink>::shared_ptr(in_RSI,in_RDI);
  MVar1.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (MasterLinkPtr)MVar1.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MasterLinkPtr ServiceManager::getMasterLink() const
{
  return master_link_;
}